

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 GenStateCompileFunc(jx9_gen_state *pGen,SyString *pName,sxi32 iFlags,jx9_vm_func **ppFunc)

{
  sxu32 nLine_00;
  sxi32 sVar1;
  char *zName_00;
  sxi32 rc;
  char *zName;
  SyToken *pSStack_40;
  sxu32 nLine;
  SyToken *pEnd;
  jx9_vm_func *pFunc;
  jx9_vm_func **ppFunc_local;
  SyString *pSStack_20;
  sxi32 iFlags_local;
  SyString *pName_local;
  jx9_gen_state *pGen_local;
  
  nLine_00 = pGen->pIn->nLine;
  pGen->pIn = pGen->pIn + 1;
  pFunc = (jx9_vm_func *)ppFunc;
  ppFunc_local._4_4_ = iFlags;
  pSStack_20 = pName;
  pName_local = (SyString *)pGen;
  jx9DelimitNestedTokens(pGen->pIn,pGen->pEnd,0x200,0x400,&stack0xffffffffffffffc0);
  if (pSStack_40 < (SyToken *)pName_local[0x16].zString) {
    pEnd = (SyToken *)SyMemBackendPoolAlloc((SyMemBackend *)pName_local->zString,0xb0);
    if ((pEnd == (SyToken *)0x0) ||
       (zName_00 = SyMemBackendStrDup((SyMemBackend *)pName_local->zString,pSStack_20->zString,
                                      pSStack_20->nByte), zName_00 == (char *)0x0)) {
      pGen_local._4_4_ = GenStateOutOfMem((jx9_gen_state *)pName_local);
    }
    else {
      jx9VmInitFuncState((jx9_vm *)pName_local->zString,(jx9_vm_func *)pEnd,zName_00,
                         pSStack_20->nByte,ppFunc_local._4_4_,(void *)0x0);
      if ((*(SyToken **)&pName_local[0x15].nByte < pSStack_40) &&
         (sVar1 = GenStateCollectFuncArgs
                            ((jx9_vm_func *)pEnd,(jx9_gen_state *)pName_local,pSStack_40),
         sVar1 == -10)) {
        pGen_local._4_4_ = -10;
      }
      else {
        *(SyToken **)&pName_local[0x15].nByte = pSStack_40 + 1;
        sVar1 = GenStateCompileFuncBody((jx9_gen_state *)pName_local,(jx9_vm_func *)pEnd);
        if (sVar1 == -10) {
          pGen_local._4_4_ = -10;
        }
        else {
          if (pFunc != (jx9_vm_func *)0x0) {
            (pFunc->aArgs).pAllocator = (SyMemBackend *)pEnd;
          }
          pGen_local._4_4_ =
               jx9VmInstallUserFunction
                         ((jx9_vm *)pName_local->zString,(jx9_vm_func *)pEnd,(SyString *)0x0);
        }
      }
    }
  }
  else {
    sVar1 = jx9GenCompileError((jx9_gen_state *)pName_local,1,nLine_00,
                               "Missing \')\' after function \'%z\' signature",pSStack_20);
    if (sVar1 == -10) {
      pGen_local._4_4_ = -10;
    }
    else {
      *(char **)&pName_local[0x15].nByte = pName_local[0x16].zString;
      pGen_local._4_4_ = 0;
    }
  }
  return pGen_local._4_4_;
}

Assistant:

static sxi32 GenStateCompileFunc(
	jx9_gen_state *pGen, /* Code generator state */
	SyString *pName,     /* Function name. NULL otherwise */
	sxi32 iFlags,        /* Control flags */
	jx9_vm_func **ppFunc /* OUT: function state */
	)
{
	jx9_vm_func *pFunc;
	SyToken *pEnd;
	sxu32 nLine;
	char *zName;
	sxi32 rc;
	/* Extract line number */
	nLine = pGen->pIn->nLine;
	/* Jump the left parenthesis '(' */
	pGen->pIn++;
	/* Delimit the function signature */
	jx9DelimitNestedTokens(pGen->pIn, pGen->pEnd, JX9_TK_LPAREN /* '(' */, JX9_TK_RPAREN /* ')' */, &pEnd);
	if( pEnd >= pGen->pEnd ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "Missing ')' after function '%z' signature", pName);
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		pGen->pIn = pGen->pEnd;
		return SXRET_OK;
	}
	/* Create the function state */
	pFunc = (jx9_vm_func *)SyMemBackendPoolAlloc(&pGen->pVm->sAllocator, sizeof(jx9_vm_func));
	if( pFunc == 0 ){
		goto OutOfMem;
	}
	/* function ID */
	zName = SyMemBackendStrDup(&pGen->pVm->sAllocator, pName->zString, pName->nByte);
	if( zName == 0 ){
		/* Don't worry about freeing memory, everything will be released shortly */
		goto OutOfMem;
	}
	/* Initialize the function state */
	jx9VmInitFuncState(pGen->pVm, pFunc, zName, pName->nByte, iFlags, 0);
	if( pGen->pIn < pEnd ){
		/* Collect function arguments */
		rc = GenStateCollectFuncArgs(pFunc, &(*pGen), pEnd);
		if( rc == SXERR_ABORT ){
			/* Don't worry about freeing memory, everything will be released shortly */
			return SXERR_ABORT;
		}
	}
	/* Compile function body */
	pGen->pIn = &pEnd[1];
	/* Compile the body */
	rc = GenStateCompileFuncBody(&(*pGen), pFunc);
	if( rc == SXERR_ABORT ){
		return SXERR_ABORT;
	}
	if( ppFunc ){
		*ppFunc = pFunc;
	}
	/* Finally register the function */
	rc = jx9VmInstallUserFunction(pGen->pVm, pFunc, 0);
	return rc;
	/* Fall through if something goes wrong */
OutOfMem:
	/* If the supplied memory subsystem is so sick that we are unable to allocate
	 * a tiny chunk of memory, there is no much we can do here.
	 */
	return GenStateOutOfMem(pGen);
}